

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

void __thiscall Js::ScriptContext::PrintStats(ScriptContext *this)

{
  RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
  *this_00;
  uint *addr;
  uint uVar1;
  undefined4 uVar2;
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar3;
  Type pcVar4;
  long *plVar5;
  FunctionBody *this_01;
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar6;
  EntryPointInfo *pEVar7;
  BailoutStatsMap *pBVar8;
  Type pSVar9;
  WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
  *pWVar10;
  WeakRefDictionaryEntry<const_Js::FunctionBody,_Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>_>
  *pWVar11;
  ParseableFunctionInfo *pPVar12;
  RejitStats *pRVar13;
  Type piVar14;
  FieldAccessStatsByFunctionNumberMap *pFVar15;
  SimpleDictionaryEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>_>
  *pSVar16;
  FieldAccessStatsEntry *pFVar17;
  SListBase<Js::FieldAccessStats_*,_Memory::Recycler,_RealCount> *pSVar18;
  CacheDataMap *pCVar19;
  SimpleDictionaryEntry<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>
  *pSVar20;
  PolymorphicInlineCache *pPVar21;
  RegexStatsDatabase *this_02;
  code *pcVar22;
  undefined1 auVar23 [8];
  bool bVar24;
  bool bVar25;
  uint32 uVar26;
  uint32 uVar27;
  uint32 uVar28;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar29;
  undefined4 *puVar30;
  char16 *pcVar31;
  char16 *pcVar32;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ptrdiff_t pVar33;
  void *pvVar34;
  char *pcVar35;
  Type *pTVar36;
  DebugWriter *w;
  undefined4 uVar37;
  uint uVar38;
  long lVar39;
  uint uVar40;
  char16_t *pcVar41;
  int iVar42;
  long lVar43;
  uint i;
  uint uVar44;
  int index;
  int iVar45;
  ulong uVar46;
  long lVar47;
  uint uVar48;
  uint uVar49;
  int iVar50;
  char16_t *pcVar51;
  ulong uVar52;
  byte bVar53;
  int j;
  long lVar54;
  ulong uVar55;
  undefined1 auStack_7a8 [8];
  uint totalBuckets [15];
  undefined1 auStack_5a8 [8];
  char16 debugStringBuffer_1 [42];
  undefined1 auStack_3a8 [8];
  char16 debugStringBuffer [42];
  uint auStack_1a8 [2];
  uint usedNativeCodeBuckets [15];
  uint rejits [15];
  uint nativeCodeBuckets [15];
  uint local_64;
  uint local_58;
  uint local_54;
  double pct;
  
  if (DAT_015c7941 == '\x01') {
    ProfileTypes(this);
  }
  if (DAT_015c7943 == '\x01') {
    Output::Print(L"CodeSize: %6d\nBailOutRecord Size: %6d\nLocalOffsets Size: %6d\n",this->codeSize
                  ,this->bailOutRecordBytes);
  }
  if (DAT_015c7934 == '\x01') {
    ProfileObjectLiteral(this);
  }
  if (this->stringProfiler != (StringProfiler *)0x0) {
    StringProfiler::PrintAll(this->stringProfiler);
    Memory::DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::StringProfiler>
              (&this->miscAllocator,this->stringProfiler);
    this->stringProfiler = (StringProfiler *)0x0;
  }
  if ((this->profileMemoryDump == true) && (bVar24 = MemoryProfiler::IsTraceEnabled(false), bVar24))
  {
    MemoryProfiler::PrintAll();
    bVar24 = Phases::IsEnabled((Phases *)&DAT_015d05c0,AllPhase);
    if ((bVar24) || (bVar24 = Phases::IsEnabled((Phases *)&DAT_015d05c0,RunPhase), bVar24)) {
      Memory::Recycler::PrintAllocStats(this->recycler);
    }
  }
  bVar24 = Phases::IsEnabled((Phases *)&DAT_015ca868,ByteCodePhase);
  if (bVar24) {
    Output::Print(L" Total Bytecode size: <%d, %d, %d> = %d\n");
  }
  if (DAT_015aa3a8 == '\x01') {
    lVar54 = 0;
    Output::Print(L"ByteCode Histogram\n");
    Output::Print(L"\n");
    uVar48 = 0;
    uVar40 = 0;
    do {
      uVar48 = uVar48 + this->byteCodeHistogram[lVar54];
      uVar40 = (uVar40 + 1) - (uint)(this->byteCodeHistogram[lVar54] == 0);
      lVar54 = lVar54 + 1;
    } while (lVar54 != 0x189);
    Output::Print(L"%9u                     Total executed ops\n",(ulong)uVar48);
    Output::Print(L"\n");
    uVar49 = 0xffffffff;
    pct = 0.0;
    do {
      uVar55 = 0;
      uVar46 = 0xffffffff;
      uVar44 = 0;
      do {
        bVar24 = OpCodeUtil::IsValidOpcode((OpCode)uVar55);
        if ((bVar24) && (uVar1 = this->byteCodeHistogram[uVar55], uVar44 < uVar1 && uVar1 < uVar49))
        {
          uVar46 = uVar55 & 0xffffffff;
          uVar44 = uVar1;
        }
        uVar55 = uVar55 + 1;
      } while (uVar55 != 0x189);
      iVar45 = (int)uVar46;
      if (iVar45 != -1) {
        uVar49 = this->byteCodeHistogram[iVar45];
        uVar46 = 0;
        do {
          bVar24 = OpCodeUtil::IsValidOpcode((OpCode)uVar46);
          if ((bVar24) && (uVar49 == this->byteCodeHistogram[uVar46])) {
            pct = pct + (double)uVar49 / (double)uVar48;
            OpCodeUtil::GetOpCodeName((OpCode)uVar46);
            Output::Print(L"%9u  %5.1lf  %5.1lf  %04x %s\n",
                          SUB84(((double)uVar49 / (double)uVar48) * 100.0,0),pct * 100.0,
                          (ulong)uVar49,uVar46 & 0xffff);
          }
          uVar46 = uVar46 + 1;
        } while (uVar46 != 0x189);
      }
    } while (iVar45 != -1);
    Output::Print(L"\n");
    Output::Print(L"Unique opcodes: %d\n",(ulong)uVar40);
  }
  bVar24 = Phases::IsEnabled((Phases *)&DAT_015ca868,BGJitPhase);
  if ((!bVar24) ||
     ((this->interpretedCount < 0x33 &&
      (bVar24 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,ForceFlag),
      !bVar24)))) goto LAB_007939f2;
  totalBuckets[10] = 0;
  totalBuckets[0xb] = 0;
  totalBuckets[0xc] = 0;
  totalBuckets[6] = 0;
  totalBuckets[7] = 0;
  totalBuckets[8] = 0;
  totalBuckets[9] = 0;
  totalBuckets[2] = 0;
  totalBuckets[3] = 0;
  totalBuckets[4] = 0;
  totalBuckets[5] = 0;
  auStack_7a8 = (undefined1  [8])0x0;
  totalBuckets[0] = 0;
  totalBuckets[1] = 0;
  stack0xfffffffffffffed8 = (SListBase<Js::FieldAccessStats_*,_Memory::Recycler,_RealCount> *)0x0;
  usedNativeCodeBuckets[10] = 0;
  usedNativeCodeBuckets[0xb] = 0;
  usedNativeCodeBuckets[0xc] = 0;
  usedNativeCodeBuckets[6] = 0;
  usedNativeCodeBuckets[7] = 0;
  usedNativeCodeBuckets[8] = 0;
  usedNativeCodeBuckets[9] = 0;
  usedNativeCodeBuckets[2] = 0;
  usedNativeCodeBuckets[3] = 0;
  usedNativeCodeBuckets[4] = 0;
  usedNativeCodeBuckets[5] = 0;
  usedNativeCodeBuckets[0] = 0;
  usedNativeCodeBuckets[1] = 0;
  rejits[10] = 0;
  rejits[0xb] = 0;
  rejits[0xc] = 0;
  rejits[6] = 0;
  rejits[7] = 0;
  rejits[8] = 0;
  rejits[9] = 0;
  rejits[2] = 0;
  rejits[3] = 0;
  rejits[4] = 0;
  rejits[5] = 0;
  stack0xfffffffffffffe98 = 0;
  rejits[0] = 0;
  rejits[1] = 0;
  Output::Print(L"Script Context: 0x%p Url: %s\n",this,this->url);
  this_00 = &this->sourceList;
  pLVar29 = Memory::
            RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
            ::operator->(this_00);
  local_64 = 0;
  local_58 = 0;
  local_54 = 0;
  uVar40 = 0;
  if (0 < (pLVar29->
          super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
          ).count) {
    puVar30 = (undefined4 *)__tls_get_addr();
    lVar54 = 0;
    lVar43 = 0;
    do {
      pRVar3 = (pLVar29->
               super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
               ).buffer.ptr[lVar43].ptr;
      if ((((ulong)pRVar3 & 1) == 0 && pRVar3 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0)
         && (pcVar4 = (pRVar3->super_RecyclerWeakReferenceBase).strongRef, pcVar4 != (Type)0x0)) {
        plVar5 = *(long **)(pcVar4 + 0x18);
        if ((plVar5 == (long *)0x0) || (*(int *)((long)plVar5 + 0x1c) == 0)) {
          lVar54 = 0;
        }
        else {
          lVar54 = 0;
          uVar46 = 0;
          do {
            iVar45 = *(int *)(*plVar5 + uVar46 * 4);
            lVar39 = lVar54;
            while (lVar54 = lVar39, iVar45 != -1) {
              lVar39 = (long)iVar45;
              iVar45 = *(int *)(plVar5[1] + 8 + lVar39 * 0x10);
              lVar39 = *(long *)(plVar5[1] + lVar39 * 0x10);
              if (lVar39 == 0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar30 = 1;
                bVar24 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                             ,199,"(functionBody)","functionBody");
                if (!bVar24) goto LAB_00794509;
                *puVar30 = 0;
                lVar39 = lVar54;
              }
            }
            uVar46 = uVar46 + 1;
          } while (uVar46 < *(uint *)((long)plVar5 + 0x1c));
        }
        if (lVar54 != 0) break;
      }
      lVar43 = lVar43 + 1;
    } while (lVar43 < (pLVar29->
                      super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                      ).count);
    if (lVar54 != 0) {
      local_64 = 0;
      if (DAT_015d346a == '\x01') {
        Output::TraceStats(BGJitPhase,L"Function list\n");
      }
      if (DAT_015d346a == '\x01') {
        Output::TraceStats(BGJitPhase,L"===============================\n");
      }
      if (DAT_015d346a == '\x01') {
        Output::TraceStats(BGJitPhase,L"%-24s, %-8s, %-10s, %-10s, %-10s, %-10s, %-10s\n",
                           L"Function",L"InterpretedCount",L"ByteCodeInLoopSize",L"ByteCodeSize",
                           L"IsJitted",L"IsUsed",L"NativeCodeSize");
      }
      if (this_00->ptr !=
          (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
           *)0x0) {
        pLVar29 = Memory::
                  RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
                  ::operator->(this_00);
        local_58 = 0;
        local_54 = 0;
        uVar40 = 0;
        if (0 < (pLVar29->
                super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                ).count) {
          puVar30 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          local_64 = 0;
          local_58 = 0;
          local_54 = 0;
          uVar40 = 0;
          lVar54 = 0;
          do {
            pRVar3 = (pLVar29->
                     super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                     ).buffer.ptr[lVar54].ptr;
            if ((((((ulong)pRVar3 & 1) == 0 &&
                   pRVar3 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0) &&
                 (pcVar4 = (pRVar3->super_RecyclerWeakReferenceBase).strongRef, pcVar4 != (Type)0x0)
                 ) && (plVar5 = *(long **)(pcVar4 + 0x18), plVar5 != (long *)0x0)) &&
               (*(int *)((long)plVar5 + 0x1c) != 0)) {
              uVar46 = 0;
              do {
                iVar45 = *(int *)(*plVar5 + uVar46 * 4);
                while (iVar45 != -1) {
                  lVar43 = (long)iVar45;
                  iVar45 = *(int *)(plVar5[1] + 8 + lVar43 * 0x10);
                  this_01 = *(FunctionBody **)(plVar5[1] + lVar43 * 0x10);
                  if (this_01 == (FunctionBody *)0x0) {
                    AssertCount = AssertCount + 1;
                    Throw::LogAssert();
                    *puVar30 = 1;
                    bVar24 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                                 ,0xa2,"(functionBody)","functionBody");
                    if (!bVar24) goto LAB_00794509;
                    *puVar30 = 0;
                  }
                  uVar26 = FunctionBody::GetInterpretedCount(this_01);
                  if (((uVar26 < 2) &&
                      (bVar24 = ConfigFlagsTable::IsEnabled
                                          ((ConfigFlagsTable *)&Configuration::Global,ForceFlag),
                      !bVar24)) ||
                     ((pSVar6 = (this_01->entryPoints).ptr,
                      pSVar6 == (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                                 *)0x0 ||
                      ((pSVar6->
                       super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                       ).
                       super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                       .count < 1)))) {
                    bVar53 = 0;
                  }
                  else {
                    bVar53 = 0;
                    lVar43 = 0;
                    do {
                      pEVar7 = (EntryPointInfo *)
                               (((pSVar6->
                                 super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                                 ).
                                 super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                                 .buffer.ptr[lVar43].ptr)->super_RecyclerWeakReferenceBase).
                               strongRef;
                      if (pEVar7 != (EntryPointInfo *)0x0) {
                        bVar24 = EntryPointInfo::IsNativeCode(pEVar7);
                        if (DAT_015d346a == '\x01') {
                          pcVar31 = ParseableFunctionInfo::GetExternalDisplayName
                                              (&this_01->super_ParseableFunctionInfo);
                          pcVar32 = FunctionProxy::GetDebugNumberSet
                                              ((FunctionProxy *)this_01,(wchar (*) [42])auStack_3a8)
                          ;
                          uVar48 = 0x2a;
                          if (lVar43 == 0) {
                            uVar48 = 0x20;
                          }
                          uVar26 = FunctionBody::GetInterpretedCount(this_01);
                          uVar27 = FunctionBody::GetCountField(this_01,ByteCodeInLoopCount);
                          uVar28 = FunctionBody::GetCountField(this_01,ByteCodeCount);
                          bVar25 = EntryPointInfo::IsNativeCode(pEVar7);
                          pcVar41 = L"Interpreted";
                          if (bVar25) {
                            pcVar41 = L"Jitted";
                          }
                          pcVar51 = L"Used";
                          if ((this_01->field_0x178 & 2) == 0) {
                            pcVar51 = L"NotUsed";
                          }
                          bVar25 = EntryPointInfo::IsNativeCode(pEVar7);
                          if (bVar25) {
                            pVar33 = EntryPointInfo::GetCodeSize(pEVar7);
                          }
                          else {
                            pVar33 = 0;
                          }
                          Output::TraceStats(BGJitPhase,
                                             L"%-20s %16s %c, %8d , %10d , %10d, %-10s, %-10s, %10d\n"
                                             ,pcVar31,pcVar32,(ulong)uVar48,uVar26,
                                             CONCAT44(extraout_var,uVar27),
                                             CONCAT44(extraout_var_00,uVar28),pcVar41,pcVar51,pVar33
                                            );
                        }
                        bVar53 = bVar53 | bVar24;
                      }
                      lVar43 = lVar43 + 1;
                    } while (lVar43 < (pSVar6->
                                      super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                                      ).
                                      super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                                      .count);
                  }
                  uVar26 = FunctionBody::GetInterpretedCount(this_01);
                  if (uVar26 == 0) {
                    local_54 = local_54 + 1;
                    uVar26 = FunctionBody::GetCountField(this_01,ByteCodeCount);
                    local_58 = (local_58 + 1) - (uint)(uVar26 == 0);
                  }
                  else {
                    uVar26 = FunctionBody::GetInterpretedCount(this_01);
                    local_64 = local_64 + (uVar26 == 1);
                  }
                  uVar26 = FunctionBody::GetInterpretedCount(this_01);
                  if (uVar26 < 100) {
                    uVar55 = (ulong)uVar26 / 0x14;
                  }
                  else {
                    uVar55 = 0xe;
                    if (uVar26 < 1000) {
                      uVar55 = (ulong)(uVar26 / 100 + 4);
                    }
                  }
                  totalBuckets[uVar55 - 2] = totalBuckets[uVar55 - 2] + 1;
                  if (bVar53 != 0) {
                    rejits[uVar55 + 0xe] = rejits[uVar55 + 0xe] + 1;
                    if ((this_01->field_0x178 & 2) != 0) {
                      usedNativeCodeBuckets[uVar55 - 2] = usedNativeCodeBuckets[uVar55 - 2] + 1;
                    }
                    pSVar6 = (this_01->entryPoints).ptr;
                    if ((pSVar6 != (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                                    *)0x0) &&
                       (1 < (pSVar6->
                            super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                            ).
                            super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                            .count)) {
                      usedNativeCodeBuckets[uVar55 + 0xe] = usedNativeCodeBuckets[uVar55 + 0xe] + 1;
                    }
                  }
                  pvVar34 = FunctionProxy::GetAuxPtr((FunctionProxy *)this_01,LoopHeaderArray);
                  if ((pvVar34 != (void *)0x0) &&
                     (uVar26 = FunctionBody::GetCountField(this_01,LoopCount), uVar26 != 0)) {
                    uVar55 = 0;
                    do {
                      lVar39 = uVar55 * 0x30;
                      FunctionBody::GetLoopBodyName(this_01,(uint)uVar55,(WCHAR *)auStack_3a8,0x100)
                      ;
                      lVar43 = *(long *)((long)pvVar34 + lVar39);
                      if ((lVar43 != 0) && (0 < *(int *)(lVar43 + 0x10))) {
                        lVar47 = 0;
                        do {
                          pEVar7 = *(EntryPointInfo **)(*(long *)(lVar43 + 8) + lVar47 * 8);
                          if ((pEVar7 != (EntryPointInfo *)0x0) &&
                             (bVar24 = EntryPointInfo::IsNativeCode(pEVar7), bVar24)) {
                            if (DAT_015d346a == '\x01') {
                              pcVar31 = FunctionProxy::GetDebugNumberSet
                                                  ((FunctionProxy *)this_01,
                                                   (wchar (*) [42])auStack_5a8);
                              uVar37 = 0x2a;
                              if (lVar47 == 0) {
                                uVar37 = 0x20;
                              }
                              uVar52 = (ulong)(uint)(*(int *)((long)pvVar34 + lVar39 + 0xc) -
                                                    *(int *)((long)pvVar34 + lVar39 + 8));
                              uVar2 = *(undefined4 *)((long)pvVar34 + lVar39 + 0x10);
                              pcVar41 = L"NotUsed";
                              if (*(char *)&pEVar7[1].super_ProxyEntryPointInfo.jsMethod != '\0') {
                                pcVar41 = L"Used";
                              }
                              pVar33 = EntryPointInfo::GetCodeSize(pEVar7);
                              Output::TraceStats(BGJitPhase,
                                                 L"%-20s %16s %c, %8d , %10d , %10d, %-10s, %-10s, %10d\n"
                                                 ,auStack_3a8,pcVar31,uVar37,uVar2,uVar52,uVar52,
                                                 L"Jitted",pcVar41,pVar33);
                            }
                            uVar40 = uVar40 + *(byte *)&pEVar7[1].super_ProxyEntryPointInfo.jsMethod
                            ;
                          }
                          lVar47 = lVar47 + 1;
                        } while (lVar47 < *(int *)(lVar43 + 0x10));
                      }
                      uVar55 = uVar55 + 1;
                    } while (uVar55 != uVar26);
                  }
                }
                uVar46 = uVar46 + 1;
              } while (uVar46 < *(uint *)((long)plVar5 + 0x1c));
            }
            lVar54 = lVar54 + 1;
          } while (lVar54 < (pLVar29->
                            super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                            ).count);
        }
        goto LAB_00793829;
      }
    }
    local_64 = 0;
    local_58 = 0;
    local_54 = 0;
    uVar40 = 0;
  }
LAB_00793829:
  Output::Print(L"**  SpeculativelyJitted: %6d FunctionsJitted: %6d JittedUsed: %6d Usage:%f ByteCodesJitted: %6d JitCodeUsed: %6d Usage: %f \n"
                ,SUB84((double)(((float)this->funcJitCodeUsed / (float)this->funcJITCount) * 100.0),
                       0),
                (double)(((float)this->jitCodeUsed / (float)this->bytecodeJITCount) * 100.0),
                (ulong)this->speculativeJitCount);
  Output::Print(L"** LoopJITCount: %6d LoopJitCodeUsed: %6d Usage: %f\n",
                SUB84((double)(((float)uVar40 / (float)this->loopJITCount) * 100.0),0),
                (ulong)this->loopJITCount,(ulong)uVar40);
  Output::Print(L"** TotalInterpretedCalls: %6d MaxFuncInterp: %6d  InterpretedHighPri: %6d \n",
                (ulong)this->interpretedCount,(ulong)this->maxFuncInterpret,
                (ulong)this->interpretedCallsHighPri);
  Output::Print(L"** ZeroInterpretedFunctions: %6d OneInterpretedFunctions: %6d ZeroInterpretedWithNonZeroBytecode: %6d \n "
                ,(ulong)local_54,(ulong)local_64,(ulong)local_58);
  Output::Print(L"** %-24s : %-10s %-10s %-10s %-10s %-10s\n",L"InterpretedCounts",L"Total",
                L"NativeCode",L"Used",L"Usage",L"Rejits");
  uVar55 = 0;
  uVar46 = 0;
  do {
    uVar52 = (ulong)((int)uVar46 + 100);
    if (uVar55 == 0xe) {
      uVar52 = 100000;
    }
    if (uVar55 < 5) {
      uVar52 = (ulong)((int)uVar46 + 0x14);
    }
    Output::Print(L"** %10d - %10d : %10d %10d %10d %7.2f %10d\n",
                  SUB84((double)(((float)usedNativeCodeBuckets[uVar55 - 2] /
                                 (float)rejits[uVar55 + 0xe]) * 100.0),0),uVar46,uVar52);
    uVar55 = uVar55 + 1;
    uVar46 = uVar52;
  } while (uVar55 != 0xf);
  Output::Print(L"\n\n");
LAB_007939f2:
  bVar24 = Phases::IsEnabled((Phases *)&DAT_015ca868,ReJITPhase);
  if (bVar24) {
    Output::Print(L"%-40s %6s\n",L"Bailout Reason,",L"Count");
    pBVar8 = this->bailoutReasonCounts;
    uVar40 = 0;
    if (pBVar8->bucketCount != 0) {
      uVar40 = 0;
      uVar46 = 0;
      do {
        iVar45 = pBVar8->buckets[uVar46];
        while (iVar45 != -1) {
          pSVar9 = pBVar8->entries;
          uVar48 = pSVar9[iVar45].
                   super_DefaultHashedEntry<unsigned_int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .super_KeyValueEntry<unsigned_int,_unsigned_int>.
                   super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
                   .super_KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>.value;
          iVar42 = pSVar9[iVar45].
                   super_DefaultHashedEntry<unsigned_int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .super_KeyValueEntry<unsigned_int,_unsigned_int>.
                   super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
                   .super_KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>.next;
          if (uVar48 != 0) {
            pcVar35 = GetBailOutKindName(pSVar9[iVar45].
                                         super_DefaultHashedEntry<unsigned_int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                         .super_KeyValueEntry<unsigned_int,_unsigned_int>.
                                         super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
                                         .super_KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>
                                         .key);
            swprintf_s<256ul>((WCHAR (*) [256])auStack_3a8,L"%S,",pcVar35);
            Output::Print(L"%-40s %6d\n",(WCHAR (*) [256])auStack_3a8,(ulong)uVar48);
          }
          uVar40 = uVar40 + uVar48;
          iVar45 = iVar42;
        }
        uVar46 = uVar46 + 1;
      } while (uVar46 < pBVar8->bucketCount);
    }
    Output::Print(L"%-40s %6d\n",L"TOTAL,",(ulong)uVar40);
    Output::Print(L"\n\n");
    Output::Print(L"%-40s %6s\n",L"Rejit Reason,",L"Count");
    lVar54 = 0;
    uVar40 = 0;
    do {
      uVar38 = this->rejitReasonCounts[lVar54];
      if (uVar38 != 0) {
        swprintf_s<256ul>((WCHAR (*) [256])auStack_7a8,L"%S,",RejitReasonNames[lVar54]);
        Output::Print(L"%-40s %6d\n",(WCHAR (*) [256])auStack_7a8,
                      (ulong)this->rejitReasonCounts[lVar54]);
      }
      uVar40 = uVar40 + uVar38;
      lVar54 = lVar54 + 1;
    } while (lVar54 != 0x2d);
    Output::Print(L"%-40s %6d\n",L"TOTAL,",(ulong)uVar40);
    Output::Print(L"\n\n");
    if ((DAT_015d346a != '\0') && (this->rejitStatsMap != (RejitStatsMap *)0x0)) {
      Output::Print(L"%-30s %14s %14s\n",L"Function (#),",L"Bailout Count,");
      pWVar10 = this->rejitStatsMap;
      if (0 < pWVar10->size) {
        lVar54 = 0;
        do {
          iVar45 = (pWVar10->buckets).ptr[lVar54];
          if (iVar45 != -1) {
            iVar42 = -1;
            do {
              pWVar11 = (pWVar10->entries).ptr;
              pPVar12 = (ParseableFunctionInfo *)
                        ((pWVar11[iVar45].key.ptr)->super_RecyclerWeakReferenceBase).strongRef;
              if (pPVar12 == (ParseableFunctionInfo *)0x0) {
                iVar50 = pWVar11[iVar45].next;
                JsUtil::
                WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
                ::RemoveEntry(pWVar10,iVar45,iVar42,(uint)lVar54);
              }
              else {
                pRVar13 = pWVar11[iVar45].value.ptr;
                uVar38 = pRVar13->m_totalRejits;
                lVar43 = 0;
                do {
                  uVar38 = uVar38 + pRVar13->m_rejitReasonCounts[lVar43];
                  pRVar13->m_totalRejits = uVar38;
                  lVar43 = lVar43 + 1;
                } while (lVar43 != 0x2d);
                pBVar8 = pRVar13->m_bailoutReasonCounts;
                uVar40 = pBVar8->bucketCount;
                if ((ulong)uVar40 != 0) {
                  piVar14 = pBVar8->buckets;
                  pSVar9 = pBVar8->entries;
                  uVar46 = 0;
                  do {
                    if (piVar14[uVar46] != -1) {
                      uVar38 = pRVar13->m_totalBailouts;
                      iVar42 = piVar14[uVar46];
                      do {
                        iVar50 = pSVar9[iVar42].
                                 super_DefaultHashedEntry<unsigned_int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                 .super_KeyValueEntry<unsigned_int,_unsigned_int>.
                                 super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
                                 .super_KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>.next;
                        uVar38 = uVar38 + pSVar9[iVar42].
                                          super_DefaultHashedEntry<unsigned_int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                          .super_KeyValueEntry<unsigned_int,_unsigned_int>.
                                          super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
                                          .
                                          super_KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>
                                          .value;
                        pRVar13->m_totalBailouts = uVar38;
                        iVar42 = iVar50;
                      } while (iVar50 != -1);
                    }
                    uVar46 = uVar46 + 1;
                  } while (uVar46 != uVar40);
                }
                pcVar31 = ParseableFunctionInfo::GetExternalDisplayName(pPVar12);
                pcVar32 = FunctionProxy::GetDebugNumberSet
                                    ((FunctionProxy *)pPVar12,(wchar (*) [42])auStack_5a8);
                swprintf_s<256ul>((WCHAR (*) [256])auStack_3a8,L"%s (%s),",pcVar31,pcVar32);
                Output::Print(L"%-30s %14d, %14d\n",(WCHAR (*) [256])auStack_3a8,
                              (ulong)pRVar13->m_totalBailouts,(ulong)pRVar13->m_totalRejits);
                iVar50 = pWVar11[iVar45].next;
                iVar42 = iVar45;
              }
              iVar45 = iVar50;
            } while (iVar45 != -1);
          }
          lVar54 = lVar54 + 1;
        } while (lVar54 < pWVar10->size);
      }
      Output::Print(L"\n\n");
      pWVar10 = this->rejitStatsMap;
      if (0 < pWVar10->size) {
        lVar54 = 0;
        do {
          iVar45 = (pWVar10->buckets).ptr[lVar54];
          if (iVar45 != -1) {
            iVar42 = -1;
            do {
              pWVar11 = (pWVar10->entries).ptr;
              pPVar12 = (ParseableFunctionInfo *)
                        ((pWVar11[iVar45].key.ptr)->super_RecyclerWeakReferenceBase).strongRef;
              if (pPVar12 == (ParseableFunctionInfo *)0x0) {
                iVar50 = pWVar11[iVar45].next;
                JsUtil::
                WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
                ::RemoveEntry(pWVar10,iVar45,iVar42,(uint)lVar54);
              }
              else {
                pRVar13 = pWVar11[iVar45].value.ptr;
                pcVar31 = ParseableFunctionInfo::GetExternalDisplayName(pPVar12);
                pcVar32 = FunctionProxy::GetDebugNumberSet
                                    ((FunctionProxy *)pPVar12,(wchar (*) [42])(rejits + 0xe));
                swprintf_s<256ul>((WCHAR (*) [256])auStack_5a8,L"%s (%s),",pcVar31,pcVar32);
                Output::Print(L"%-30s\n\n",(WCHAR (*) [256])auStack_5a8);
                if (pRVar13->m_totalBailouts != 0) {
                  Output::Print(L"%10sBailouts:\n",L"");
                  pBVar8 = pRVar13->m_bailoutReasonCounts;
                  if (pBVar8->bucketCount != 0) {
                    uVar46 = 0;
                    do {
                      iVar42 = pBVar8->buckets[uVar46];
                      while (iVar50 = iVar42, iVar50 != -1) {
                        pSVar9 = pBVar8->entries;
                        uVar40 = pSVar9[iVar50].
                                 super_DefaultHashedEntry<unsigned_int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                 .super_KeyValueEntry<unsigned_int,_unsigned_int>.
                                 super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
                                 .super_KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>.value;
                        iVar42 = pSVar9[iVar50].
                                 super_DefaultHashedEntry<unsigned_int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                 .super_KeyValueEntry<unsigned_int,_unsigned_int>.
                                 super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
                                 .super_KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>.next;
                        if (uVar40 != 0) {
                          pcVar35 = GetBailOutKindName(pSVar9[iVar50].
                                                                                                              
                                                  super_DefaultHashedEntry<unsigned_int,_unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                                                  .super_KeyValueEntry<unsigned_int,_unsigned_int>.
                                                  super_ValueEntry<unsigned_int,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>_>
                                                  .
                                                  super_KeyValueEntryDataLayout2<unsigned_int,_unsigned_int>
                                                  .key);
                          swprintf_s<256ul>((WCHAR (*) [256])auStack_3a8,L"%S,",pcVar35);
                          Output::Print(L"%10s%-40s %6d\n",L"",(WCHAR (*) [256])auStack_3a8,
                                        (ulong)uVar40);
                        }
                      }
                      uVar46 = uVar46 + 1;
                    } while (uVar46 < pBVar8->bucketCount);
                  }
                }
                Output::Print(L"\n");
                if (pRVar13->m_totalRejits != 0) {
                  Output::Print(L"%10sRejits:\n",L"");
                  lVar43 = 0;
                  do {
                    if (pRVar13->m_rejitReasonCounts[lVar43] != 0) {
                      swprintf_s<256ul>((WCHAR (*) [256])auStack_5a8,L"%S,",RejitReasonNames[lVar43]
                                       );
                      Output::Print(L"%10s%-40s %6d\n",L"",(WCHAR (*) [256])auStack_5a8,
                                    (ulong)pRVar13->m_rejitReasonCounts[lVar43]);
                    }
                    lVar43 = lVar43 + 1;
                  } while (lVar43 != 0x2d);
                  Output::Print(L"\n\n");
                }
                iVar50 = pWVar11[iVar45].next;
                iVar42 = iVar45;
              }
              iVar45 = iVar50;
            } while (iVar45 != -1);
          }
          lVar54 = lVar54 + 1;
        } while (lVar54 < pWVar10->size);
      }
    }
  }
  ClearBailoutReasonCountsMap(this);
  ClearRejitReasonCountsArray(this);
  bVar24 = Phases::IsEnabled((Phases *)&DAT_015ca868,ObjTypeSpecPhase);
  if (bVar24) {
    debugStringBuffer_1[0x14] = L'\0';
    debugStringBuffer_1[0x15] = L'\0';
    debugStringBuffer_1[0x16] = L'\0';
    debugStringBuffer_1[0x17] = L'\0';
    debugStringBuffer_1[0x18] = L'\0';
    debugStringBuffer_1[0x19] = L'\0';
    debugStringBuffer_1[0xc] = L'\0';
    debugStringBuffer_1[0xd] = L'\0';
    debugStringBuffer_1[0xe] = L'\0';
    debugStringBuffer_1[0xf] = L'\0';
    debugStringBuffer_1[0x10] = L'\0';
    debugStringBuffer_1[0x11] = L'\0';
    debugStringBuffer_1[0x12] = L'\0';
    debugStringBuffer_1[0x13] = L'\0';
    debugStringBuffer_1[4] = L'\0';
    debugStringBuffer_1[5] = L'\0';
    debugStringBuffer_1[6] = L'\0';
    debugStringBuffer_1[7] = L'\0';
    debugStringBuffer_1[8] = L'\0';
    debugStringBuffer_1[9] = L'\0';
    debugStringBuffer_1[10] = L'\0';
    debugStringBuffer_1[0xb] = L'\0';
    auStack_5a8 = (undefined1  [8])0x0;
    debugStringBuffer_1[0] = L'\0';
    debugStringBuffer_1[1] = L'\0';
    debugStringBuffer_1[2] = L'\0';
    debugStringBuffer_1[3] = L'\0';
    pFVar15 = this->fieldAccessStatsByFunctionNumber;
    if ((pFVar15 != (FieldAccessStatsByFunctionNumberMap *)0x0) && (pFVar15->bucketCount != 0)) {
      puVar30 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      addr = rejits + 0xe;
      uVar46 = 0;
      do {
        iVar45 = (pFVar15->buckets).ptr[uVar46];
        if (iVar45 != -1) {
LAB_00794045:
          pSVar16 = (pFVar15->entries).ptr;
          iVar42 = pSVar16[iVar45].
                   super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .
                   super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>_>
                   .
                   super_ValueEntry<Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>_>_>
                   .
                   super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>_>
                   .next;
          uVar40 = pSVar16[iVar45].
                   super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .
                   super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>_>
                   .
                   super_ValueEntry<Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>_>_>
                   .
                   super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>_>
                   .key;
          pFVar17 = pSVar16[iVar45].
                    super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    .
                    super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>_>
                    .
                    super_ValueEntry<Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>_>_>
                    .
                    super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::ScriptContext::FieldAccessStatsEntry>_>
                    .value.ptr;
          debugStringBuffer[0x14] = L'\0';
          debugStringBuffer[0x15] = L'\0';
          debugStringBuffer[0x16] = L'\0';
          debugStringBuffer[0x17] = L'\0';
          debugStringBuffer[0x18] = L'\0';
          debugStringBuffer[0x19] = L'\0';
          debugStringBuffer[0xc] = L'\0';
          debugStringBuffer[0xd] = L'\0';
          debugStringBuffer[0xe] = L'\0';
          debugStringBuffer[0xf] = L'\0';
          debugStringBuffer[0x10] = L'\0';
          debugStringBuffer[0x11] = L'\0';
          debugStringBuffer[0x12] = L'\0';
          debugStringBuffer[0x13] = L'\0';
          debugStringBuffer[4] = L'\0';
          debugStringBuffer[5] = L'\0';
          debugStringBuffer[6] = L'\0';
          debugStringBuffer[7] = L'\0';
          debugStringBuffer[8] = L'\0';
          debugStringBuffer[9] = L'\0';
          debugStringBuffer[10] = L'\0';
          debugStringBuffer[0xb] = L'\0';
          auStack_3a8 = (undefined1  [8])0x0;
          debugStringBuffer[0] = L'\0';
          debugStringBuffer[1] = L'\0';
          debugStringBuffer[2] = L'\0';
          debugStringBuffer[3] = L'\0';
          auStack_7a8 = (undefined1  [8])&pFVar17->stats;
          totalBuckets._0_8_ = auStack_7a8;
          do {
            if (totalBuckets._0_8_ == 0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar30 = 1;
              bVar24 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                           ,0x76,"(current != nullptr)","current != nullptr");
              if (!bVar24) {
LAB_00794509:
                pcVar22 = (code *)invalidInstructionException();
                (*pcVar22)();
              }
              *puVar30 = 0;
            }
            auVar23 = auStack_7a8;
            pSVar18 = *(SListBase<Js::FieldAccessStats_*,_Memory::Recycler,_RealCount> **)
                       totalBuckets._0_8_;
            Memory::Recycler::WBSetBit((char *)addr);
            unique0x10002c54 = pSVar18;
            Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
            if ((undefined1  [8])stack0xfffffffffffffed8 == auVar23) goto LAB_0079414e;
            pSVar18 = *(SListBase<Js::FieldAccessStats_*,_Memory::Recycler,_RealCount> **)
                       totalBuckets._0_8_;
            Memory::Recycler::WBSetBit((char *)addr);
            unique0x10002c5c = pSVar18;
            Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
            totalBuckets._0_8_ = stack0xfffffffffffffed8;
            pTVar36 = SListBase<Js::FieldAccessStats_*,_Memory::Recycler,_RealCount>::Iterator::Data
                                ((Iterator *)auStack_7a8);
            FieldAccessStats::Add((FieldAccessStats *)auStack_3a8,pTVar36->ptr);
          } while( true );
        }
LAB_00794298:
        uVar46 = uVar46 + 1;
      } while (uVar46 < pFVar15->bucketCount);
    }
    Output::Print(L"FieldAccessStats: totals\n");
    Output::Print(L"    overall: total %u, no profile info %u\n",(ulong)auStack_5a8 & 0xffffffff,
                  (ulong)auStack_5a8 >> 0x20);
    Output::Print(L"    mono: total %u, empty %u, cloned %u\n",
                  debugStringBuffer_1._0_8_ & 0xffffffff,(ulong)debugStringBuffer_1._0_8_ >> 0x20,
                  debugStringBuffer_1._44_8_ & 0xffffffff);
    Output::Print(L"    poly: total %u (high %u, low %u), null %u, empty %u, ignored %u, disabled %u, equivalent %u, non-equivalent %u, cloned %u\n"
                  ,debugStringBuffer_1._8_8_ & 0xffffffff,debugStringBuffer_1._24_8_ & 0xffffffff,
                  (ulong)debugStringBuffer_1._24_8_ >> 0x20,(ulong)debugStringBuffer_1._8_8_ >> 0x20
                  ,debugStringBuffer_1._16_8_ & 0xffffffff,(ulong)debugStringBuffer_1._16_8_ >> 0x20
                  ,(ulong)(uint)debugStringBuffer_1._40_4_,(ulong)(uint)debugStringBuffer_1._32_4_,
                  (ulong)(uint)debugStringBuffer_1._36_4_,(ulong)debugStringBuffer_1._44_8_ >> 0x20)
    ;
  }
  bVar24 = Phases::IsEnabled((Phases *)&DAT_015ca868,MissingPropertyCachePhase);
  if (bVar24) {
    Output::Print(L"MissingPropertyStats: hits = %d, misses = %d, cache attempts = %d.\n",
                  (ulong)(uint)this->missingPropertyHits,(ulong)(uint)this->missingPropertyMisses,
                  (ulong)(uint)this->missingPropertyCacheAttempts);
  }
  bVar24 = Phases::IsEnabled((Phases *)&DAT_015ca868,PolymorphicInlineCachePhase);
  if (bVar24) {
    Output::Print(L"%s,%s,%s,%s,%s,%s,%s,%s,%s\n",L"Function",L"Property",L"Kind",L"Accesses",
                  L"Misses",L"Miss Rate",L"Collisions",L"Collision Rate",L"Slot Count");
    pCVar19 = this->cacheDataMap;
    if (pCVar19->bucketCount != 0) {
      uVar46 = 0;
      do {
        iVar45 = (pCVar19->buckets).ptr[uVar46];
        while (iVar45 != -1) {
          pSVar20 = (pCVar19->entries).ptr;
          iVar42 = pSVar20[iVar45].
                   super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .
                   super_KeyValueEntry<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>
                   .
                   super_ValueEntry<Memory::WriteBarrierPtr<InlineCacheData>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>_>
                   .
                   super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>
                   .next;
          pPVar21 = pSVar20[iVar45].
                    super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    .
                    super_KeyValueEntry<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>
                    .
                    super_ValueEntry<Memory::WriteBarrierPtr<InlineCacheData>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>_>
                    .
                    super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>
                    .key.ptr;
          (*(pPVar21->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[6])
                    (pPVar21,pSVar20[iVar45].
                             super_DefaultHashedEntry<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                             .
                             super_KeyValueEntry<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>
                             .
                             super_ValueEntry<Memory::WriteBarrierPtr<InlineCacheData>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>_>
                             .
                             super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<const_Js::PolymorphicInlineCache>,_Memory::WriteBarrierPtr<InlineCacheData>_>
                             .value.ptr);
          iVar45 = iVar42;
        }
        uVar46 = uVar46 + 1;
      } while (uVar46 < pCVar19->bucketCount);
    }
  }
  this_02 = this->regexStatsDatabase;
  if (this_02 != (RegexStatsDatabase *)0x0) {
    w = GetRegexDebugWriter(this);
    UnifiedRegex::RegexStatsDatabase::Print(this_02,w);
  }
  Output::TraceStats(EmitterPhase,L"Script Context: 0x%p Url: %s\n",this,this->url);
  Output::TraceStats(EmitterPhase,L"  Total thread committed code size = %d\n",
                     this->threadContext->nativeCodeSize);
  Output::TraceStats(ParsePhase,L"Script Context: 0x%p Url: %s\n",this,this->url);
  Output::TraceStats(ParsePhase,L"  Total ThreadContext source size %d\n",
                     this->threadContext->sourceCodeSize);
  Output::Flush();
  return;
LAB_0079414e:
  totalBuckets[0] = 0;
  totalBuckets[1] = 0;
  bVar24 = Phases::IsEnabled((Phases *)&DAT_015ca868,ObjTypeSpecPhase);
  if ((bVar24) && (DAT_015d346a == '\x01')) {
    plVar5 = *(long **)&((pFVar17->functionBodyWeakRef).ptr)->super_RecyclerWeakReferenceBase;
    pcVar41 = L"<unknown>";
    if (plVar5 != (long *)0x0) {
      pcVar41 = (char16_t *)(**(code **)(*plVar5 + 0x38))(plVar5,L"<unknown>");
    }
    Output::Print(L"FieldAccessStats: function %s (#%u): inline cache stats:\n",pcVar41,uVar40);
    Output::Print(L"    overall: total %u, no profile info %u\n",(ulong)auStack_3a8 & 0xffffffff,
                  (ulong)auStack_3a8 >> 0x20);
    Output::Print(L"    mono: total %u, empty %u, cloned %u\n",debugStringBuffer._0_8_ & 0xffffffff,
                  (ulong)debugStringBuffer._0_8_ >> 0x20,debugStringBuffer._44_8_ & 0xffffffff);
    Output::Print(L"    poly: total %u (high %u, low %u), null %u, empty %u, ignored %u, disabled %u, equivalent %u, non-equivalent %u, cloned %u\n"
                  ,debugStringBuffer._8_8_ & 0xffffffff,debugStringBuffer._24_8_ & 0xffffffff,
                  (ulong)debugStringBuffer._24_8_ >> 0x20,(ulong)debugStringBuffer._8_8_ >> 0x20,
                  debugStringBuffer._16_8_ & 0xffffffff,(ulong)debugStringBuffer._16_8_ >> 0x20,
                  (ulong)(uint)debugStringBuffer._40_4_,(ulong)(uint)debugStringBuffer._32_4_,
                  (ulong)(uint)debugStringBuffer._36_4_,(ulong)debugStringBuffer._44_8_ >> 0x20);
  }
  FieldAccessStats::Add((FieldAccessStats *)auStack_5a8,(FieldAccessStats *)auStack_3a8);
  iVar45 = iVar42;
  if (iVar42 == -1) goto LAB_00794298;
  goto LAB_00794045;
}

Assistant:

void ScriptContext::PrintStats()
    {

#ifdef PROFILE_TYPES
        if (Configuration::Global.flags.ProfileTypes)
        {
            ProfileTypes();
        }
#endif

#ifdef PROFILE_BAILOUT_RECORD_MEMORY
        if (Configuration::Global.flags.ProfileBailOutRecordMemory)
        {
            Output::Print(_u("CodeSize: %6d\nBailOutRecord Size: %6d\nLocalOffsets Size: %6d\n"), codeSize, bailOutRecordBytes, bailOutOffsetBytes);
        }
#endif

#ifdef PROFILE_OBJECT_LITERALS
        if (Configuration::Global.flags.ProfileObjectLiteral)
        {
            ProfileObjectLiteral();
        }
#endif

#ifdef PROFILE_STRINGS
        if (stringProfiler != nullptr)
        {
            stringProfiler->PrintAll();
            Adelete(MiscAllocator(), stringProfiler);
            stringProfiler = nullptr;
        }
#endif

#ifdef PROFILE_MEM
        if (profileMemoryDump && MemoryProfiler::IsTraceEnabled())
        {
            MemoryProfiler::PrintAll();
#ifdef PROFILE_RECYCLER_ALLOC
            if (Js::Configuration::Global.flags.TraceMemory.IsEnabled(Js::AllPhase)
                || Js::Configuration::Global.flags.TraceMemory.IsEnabled(Js::RunPhase))
            {
                GetRecycler()->PrintAllocStats();
            }
#endif
        }
#endif
#if DBG_DUMP
        if (PHASE_STATS1(Js::ByteCodePhase))
        {
            Output::Print(_u(" Total Bytecode size: <%d, %d, %d> = %d\n"),
                byteCodeDataSize,
                byteCodeAuxiliaryDataSize,
                byteCodeAuxiliaryContextDataSize,
                byteCodeDataSize + byteCodeAuxiliaryDataSize + byteCodeAuxiliaryContextDataSize);
        }

        if (Configuration::Global.flags.BytecodeHist)
        {
            Output::Print(_u("ByteCode Histogram\n"));
            Output::Print(_u("\n"));

            uint total = 0;
            uint unique = 0;
            for (int j = 0; j < (int)OpCode::ByteCodeLast; j++)
            {
                total += byteCodeHistogram[j];
                if (byteCodeHistogram[j] > 0)
                {
                    unique++;
                }
            }
            Output::Print(_u("%9u                     Total executed ops\n"), total);
            Output::Print(_u("\n"));

            uint max = UINT_MAX;
            double pctcume = 0.0;

            while (true)
            {
                uint upper = 0;
                int index = -1;
                for (int j = 0; j < (int)OpCode::ByteCodeLast; j++)
                {
                    if (OpCodeUtil::IsValidOpcode((OpCode)j) && byteCodeHistogram[j] > upper && byteCodeHistogram[j] < max)
                    {
                        index = j;
                        upper = byteCodeHistogram[j];
                    }
                }

                if (index == -1)
                {
                    break;
                }

                max = byteCodeHistogram[index];

                for (OpCode j = (OpCode)0; j < OpCode::ByteCodeLast; j++)
                {
                    if (OpCodeUtil::IsValidOpcode(j) && max == byteCodeHistogram[(int)j])
                    {
                        double pct = ((double)max) / total;
                        pctcume += pct;

                        Output::Print(_u("%9u  %5.1lf  %5.1lf  %04x %s\n"), max, pct * 100, pctcume * 100, j, OpCodeUtil::GetOpCodeName(j));
                    }
                }
            }
            Output::Print(_u("\n"));
            Output::Print(_u("Unique opcodes: %d\n"), unique);
        }

#endif

#if ENABLE_NATIVE_CODEGEN
#ifdef BGJIT_STATS
        // We do not care about small script contexts without much activity - unless t
        if (PHASE_STATS1(Js::BGJitPhase) && (this->interpretedCount > 50 || Js::Configuration::Global.flags.IsEnabled(Js::ForceFlag)))
        {

#define MAX_BUCKETS 15
            uint loopJitCodeUsed = 0;
            uint bucketSize1 = 20;
            uint bucketSize2 = 100;
            uint size1CutOffbucketId = 4;
            uint totalBuckets[MAX_BUCKETS] = { 0 };
            uint nativeCodeBuckets[MAX_BUCKETS] = { 0 };
            uint usedNativeCodeBuckets[MAX_BUCKETS] = { 0 };
            uint rejits[MAX_BUCKETS] = { 0 };
            uint zeroInterpretedFunctions = 0;
            uint oneInterpretedFunctions = 0;
            uint nonZeroBytecodeFunctions = 0;
            Output::Print(_u("Script Context: 0x%p Url: %s\n"), this, this->url);

            FunctionBody* anyFunctionBody = this->FindFunction([](FunctionBody* body) { return body != nullptr; });

            if (anyFunctionBody)
            {
                OUTPUT_VERBOSE_STATS(Js::BGJitPhase, _u("Function list\n"));
                OUTPUT_VERBOSE_STATS(Js::BGJitPhase, _u("===============================\n"));
                OUTPUT_VERBOSE_STATS(Js::BGJitPhase, _u("%-24s, %-8s, %-10s, %-10s, %-10s, %-10s, %-10s\n"), _u("Function"), _u("InterpretedCount"), _u("ByteCodeInLoopSize"), _u("ByteCodeSize"), _u("IsJitted"), _u("IsUsed"), _u("NativeCodeSize"));

                this->MapFunction([&](FunctionBody* body)
                {
                    bool isNativeCode = false;

                    // Filtering interpreted count lowers a lot of noise
                    if (body->GetInterpretedCount() > 1 || Js::Configuration::Global.flags.IsEnabled(Js::ForceFlag))
                    {
                        body->MapEntryPoints([&](uint entryPointIndex, FunctionEntryPointInfo* entryPoint)
                        {
                            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                            char rejit = entryPointIndex > 0 ? '*' : ' ';
                            isNativeCode = entryPoint->IsNativeCode() | isNativeCode;
                            OUTPUT_VERBOSE_STATS(Js::BGJitPhase, _u("%-20s %16s %c, %8d , %10d , %10d, %-10s, %-10s, %10d\n"),
                                body->GetExternalDisplayName(),
                                body->GetDebugNumberSet(debugStringBuffer),
                                rejit,
                                body->GetInterpretedCount(),
                                body->GetByteCodeInLoopCount(),
                                body->GetByteCodeCount(),
                                entryPoint->IsNativeCode() ? _u("Jitted") : _u("Interpreted"),
                                body->GetNativeEntryPointUsed() ? _u("Used") : _u("NotUsed"),
                                entryPoint->IsNativeCode() ? entryPoint->GetCodeSize() : 0);
                        });
                    }
                    if (body->GetInterpretedCount() == 0)
                    {
                        zeroInterpretedFunctions++;
                        if (body->GetByteCodeCount() > 0)
                        {
                            nonZeroBytecodeFunctions++;
                        }
                    }
                    else if (body->GetInterpretedCount() == 1)
                    {
                        oneInterpretedFunctions++;
                    }


                    // Generate a histogram using interpreted counts.
                    uint bucket;
                    uint intrpCount = body->GetInterpretedCount();
                    if (intrpCount < 100)
                    {
                        bucket = intrpCount / bucketSize1;
                    }
                    else if (intrpCount < 1000)
                    {
                        bucket = size1CutOffbucketId  + intrpCount / bucketSize2;
                    }
                    else
                    {
                        bucket = MAX_BUCKETS - 1;
                    }

                    // Explicitly assume that the bucket count is less than the following counts (which are all equal)
                    // This is because min will return MAX_BUCKETS - 1 if the count exceeds MAX_BUCKETS - 1.
                    __analysis_assume(bucket < MAX_BUCKETS);

                    totalBuckets[bucket]++;
                    if (isNativeCode)
                    {
                        nativeCodeBuckets[bucket]++;
                        if (body->GetNativeEntryPointUsed())
                        {
                            usedNativeCodeBuckets[bucket]++;
                        }
                        if (body->HasRejit())
                        {
                            rejits[bucket]++;
                        }
                    }

                    body->MapLoopHeaders([&](uint loopNumber, LoopHeader* header)
                    {
                        char16 loopBodyName[256];
                        body->GetLoopBodyName(loopNumber, loopBodyName, _countof(loopBodyName));
                        header->MapEntryPoints([&](int index, LoopEntryPointInfo * entryPoint)
                        {
                            if (entryPoint->IsNativeCode())
                            {
                                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                                char rejit = index > 0 ? '*' : ' ';
                                OUTPUT_VERBOSE_STATS(Js::BGJitPhase, _u("%-20s %16s %c, %8d , %10d , %10d, %-10s, %-10s, %10d\n"),
                                    loopBodyName,
                                    body->GetDebugNumberSet(debugStringBuffer),
                                    rejit,
                                    header->interpretCount,
                                    header->GetByteCodeCount(),
                                    header->GetByteCodeCount(),
                                    _u("Jitted"),
                                    entryPoint->IsUsed() ? _u("Used") : _u("NotUsed"),
                                    entryPoint->GetCodeSize());
                                if (entryPoint->IsUsed())
                                {
                                    loopJitCodeUsed++;
                                }
                            }
                        });
                    });
                });
            }

            Output::Print(_u("**  SpeculativelyJitted: %6d FunctionsJitted: %6d JittedUsed: %6d Usage:%f ByteCodesJitted: %6d JitCodeUsed: %6d Usage: %f \n"),
                speculativeJitCount, funcJITCount, funcJitCodeUsed, ((float)(funcJitCodeUsed) / funcJITCount) * 100, bytecodeJITCount, jitCodeUsed, ((float)(jitCodeUsed) / bytecodeJITCount) * 100);
            Output::Print(_u("** LoopJITCount: %6d LoopJitCodeUsed: %6d Usage: %f\n"),
                loopJITCount, loopJitCodeUsed, ((float)loopJitCodeUsed / loopJITCount) * 100);
            Output::Print(_u("** TotalInterpretedCalls: %6d MaxFuncInterp: %6d  InterpretedHighPri: %6d \n"),
                interpretedCount, maxFuncInterpret, interpretedCallsHighPri);
            Output::Print(_u("** ZeroInterpretedFunctions: %6d OneInterpretedFunctions: %6d ZeroInterpretedWithNonZeroBytecode: %6d \n "), zeroInterpretedFunctions, oneInterpretedFunctions, nonZeroBytecodeFunctions);
            Output::Print(_u("** %-24s : %-10s %-10s %-10s %-10s %-10s\n"), _u("InterpretedCounts"), _u("Total"), _u("NativeCode"), _u("Used"), _u("Usage"), _u("Rejits"));
            uint low = 0;
            uint high = 0;
            for (uint i = 0; i < _countof(totalBuckets); i++)
            {
                low = high;
                if (i <= size1CutOffbucketId)
                {
                    high = low + bucketSize1;
                }
                else if (i < (_countof(totalBuckets) - 1))
                {
                    high = low + bucketSize2;               }
                else
                {
                    high = 100000;
                }
                Output::Print(_u("** %10d - %10d : %10d %10d %10d %7.2f %10d\n"), low, high, totalBuckets[i], nativeCodeBuckets[i], usedNativeCodeBuckets[i], ((float)usedNativeCodeBuckets[i] / nativeCodeBuckets[i]) * 100, rejits[i]);
            }
            Output::Print(_u("\n\n"));
        }
#undef MAX_BUCKETS
#endif

#ifdef REJIT_STATS
        if (PHASE_STATS1(Js::ReJITPhase))
        {
            uint totalBailouts = 0;
            uint totalRejits = 0;
            WCHAR buf[256];

            // Dump bailout data.
            Output::Print(_u("%-40s %6s\n"), _u("Bailout Reason,"), _u("Count"));

            bailoutReasonCounts->Map([&totalBailouts](uint kind, uint val) {
                WCHAR buf[256];
                totalBailouts += val;
                if (val != 0)
                {
                    swprintf_s(buf, _u("%S,"), GetBailOutKindName((IR::BailOutKind)kind));
                    Output::Print(_u("%-40s %6d\n"), buf, val);
                }
            });


            Output::Print(_u("%-40s %6d\n"), _u("TOTAL,"), totalBailouts);
            Output::Print(_u("\n\n"));

            // Dump rejit data.
            Output::Print(_u("%-40s %6s\n"), _u("Rejit Reason,"), _u("Count"));
            for (uint i = 0; i < NumRejitReasons; ++i)
            {
                totalRejits += rejitReasonCounts[i];
                if (rejitReasonCounts[i] != 0)
                {
                    swprintf_s(buf, _u("%S,"), RejitReasonNames[i]);
                    Output::Print(_u("%-40s %6d\n"), buf, rejitReasonCounts[i]);
                }
            }
            Output::Print(_u("%-40s %6d\n"), _u("TOTAL,"), totalRejits);
            Output::Print(_u("\n\n"));

            // If in verbose mode, dump data for each FunctionBody
            if (CONFIG_FLAG(Verbose) && rejitStatsMap != nullptr)
            {
                // Aggregated data
                Output::Print(_u("%-30s %14s %14s\n"), _u("Function (#),"), _u("Bailout Count,"), _u("Rejit Count"));
                rejitStatsMap->Map([](Js::FunctionBody const *body, RejitStats *stats, RecyclerWeakReference<const Js::FunctionBody> const*) {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                    for (uint i = 0; i < NumRejitReasons; ++i)
                        stats->m_totalRejits += stats->m_rejitReasonCounts[i];

                    stats->m_bailoutReasonCounts->Map([stats](uint kind, uint val) {
                        stats->m_totalBailouts += val;
                    });

                    WCHAR buf[256];

                    swprintf_s(buf, _u("%s (%s),"), body->GetExternalDisplayName(), (const_cast<Js::FunctionBody*>(body))->GetDebugNumberSet(debugStringBuffer)); //TODO Kount
                    Output::Print(_u("%-30s %14d, %14d\n"), buf, stats->m_totalBailouts, stats->m_totalRejits);

                });
                Output::Print(_u("\n\n"));

                // Per FunctionBody data
                rejitStatsMap->Map([](Js::FunctionBody const *body, RejitStats *stats, RecyclerWeakReference<const Js::FunctionBody> const *) {
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
                    WCHAR buf[256];

                    swprintf_s(buf, _u("%s (%s),"), body->GetExternalDisplayName(), (const_cast<Js::FunctionBody*>(body))->GetDebugNumberSet(debugStringBuffer)); //TODO Kount
                    Output::Print(_u("%-30s\n\n"), buf);

                    // Dump bailout data
                    if (stats->m_totalBailouts != 0)
                    {
                        Output::Print(_u("%10sBailouts:\n"), _u(""));

                        stats->m_bailoutReasonCounts->Map([](uint kind, uint val) {
                            if (val != 0)
                            {
                                WCHAR buf[256];
                                swprintf_s(buf, _u("%S,"), GetBailOutKindName((IR::BailOutKind)kind));
                                Output::Print(_u("%10s%-40s %6d\n"), _u(""), buf, val);
                            }
                        });
                    }
                    Output::Print(_u("\n"));

                    // Dump rejit data.
                    if (stats->m_totalRejits != 0)
                    {
                        Output::Print(_u("%10sRejits:\n"), _u(""));
                        for (uint i = 0; i < NumRejitReasons; ++i)
                        {
                            if (stats->m_rejitReasonCounts[i] != 0)
                            {
                                swprintf_s(buf, _u("%S,"), RejitReasonNames[i]);
                                Output::Print(_u("%10s%-40s %6d\n"), _u(""), buf, stats->m_rejitReasonCounts[i]);
                            }
                        }
                        Output::Print(_u("\n\n"));
                    }
                });

            }
        }

        this->ClearBailoutReasonCountsMap();
        this->ClearRejitReasonCountsArray();
#endif

#ifdef FIELD_ACCESS_STATS
    if (PHASE_STATS1(Js::ObjTypeSpecPhase))
    {
        FieldAccessStats globalStats;
        if (this->fieldAccessStatsByFunctionNumber != nullptr)
        {
            this->fieldAccessStatsByFunctionNumber->Map([&globalStats](uint functionNumber, FieldAccessStatsEntry* entry)
            {
                FieldAccessStats functionStats;
                entry->stats.Map([&functionStats](FieldAccessStatsPtr entryPointStats)
                {
                    functionStats.Add(entryPointStats);
                });

                if (PHASE_VERBOSE_STATS1(Js::ObjTypeSpecPhase))
                {
                    FunctionBody* functionBody = entry->functionBodyWeakRef->Get();
                    const char16* functionName = functionBody != nullptr ? functionBody->GetDisplayName() : _u("<unknown>");
                    Output::Print(_u("FieldAccessStats: function %s (#%u): inline cache stats:\n"), functionName, functionNumber);
                    Output::Print(_u("    overall: total %u, no profile info %u\n"), functionStats.totalInlineCacheCount, functionStats.noInfoInlineCacheCount);
                    Output::Print(_u("    mono: total %u, empty %u, cloned %u\n"),
                        functionStats.monoInlineCacheCount, functionStats.emptyMonoInlineCacheCount, functionStats.clonedMonoInlineCacheCount);
                    Output::Print(_u("    poly: total %u (high %u, low %u), null %u, empty %u, ignored %u, disabled %u, equivalent %u, non-equivalent %u, cloned %u\n"),
                        functionStats.polyInlineCacheCount, functionStats.highUtilPolyInlineCacheCount, functionStats.lowUtilPolyInlineCacheCount,
                        functionStats.nullPolyInlineCacheCount, functionStats.emptyPolyInlineCacheCount, functionStats.ignoredPolyInlineCacheCount, functionStats.disabledPolyInlineCacheCount,
                        functionStats.equivPolyInlineCacheCount, functionStats.nonEquivPolyInlineCacheCount, functionStats.clonedPolyInlineCacheCount);
                }

                globalStats.Add(&functionStats);
            });
        }

        Output::Print(_u("FieldAccessStats: totals\n"));
        Output::Print(_u("    overall: total %u, no profile info %u\n"), globalStats.totalInlineCacheCount, globalStats.noInfoInlineCacheCount);
        Output::Print(_u("    mono: total %u, empty %u, cloned %u\n"),
            globalStats.monoInlineCacheCount, globalStats.emptyMonoInlineCacheCount, globalStats.clonedMonoInlineCacheCount);
        Output::Print(_u("    poly: total %u (high %u, low %u), null %u, empty %u, ignored %u, disabled %u, equivalent %u, non-equivalent %u, cloned %u\n"),
            globalStats.polyInlineCacheCount, globalStats.highUtilPolyInlineCacheCount, globalStats.lowUtilPolyInlineCacheCount,
            globalStats.nullPolyInlineCacheCount, globalStats.emptyPolyInlineCacheCount, globalStats.ignoredPolyInlineCacheCount, globalStats.disabledPolyInlineCacheCount,
            globalStats.equivPolyInlineCacheCount, globalStats.nonEquivPolyInlineCacheCount, globalStats.clonedPolyInlineCacheCount);
    }
#endif

#ifdef MISSING_PROPERTY_STATS
    if (PHASE_STATS1(Js::MissingPropertyCachePhase))
    {
        Output::Print(_u("MissingPropertyStats: hits = %d, misses = %d, cache attempts = %d.\n"),
            this->missingPropertyHits, this->missingPropertyMisses, this->missingPropertyCacheAttempts);
    }
#endif


#ifdef INLINE_CACHE_STATS
        if (PHASE_STATS1(Js::PolymorphicInlineCachePhase))
        {
            Output::Print(_u("%s,%s,%s,%s,%s,%s,%s,%s,%s\n"), _u("Function"), _u("Property"), _u("Kind"), _u("Accesses"), _u("Misses"), _u("Miss Rate"), _u("Collisions"), _u("Collision Rate"), _u("Slot Count"));
            cacheDataMap->Map([this](Js::PolymorphicInlineCache const *cache, InlineCacheData *data) {
                cache->PrintStats(data);
            });
        }
#endif

#if ENABLE_REGEX_CONFIG_OPTIONS
        if (regexStatsDatabase != 0)
            regexStatsDatabase->Print(GetRegexDebugWriter());
#endif
        OUTPUT_STATS(Js::EmitterPhase, _u("Script Context: 0x%p Url: %s\n"), this, this->url);
        OUTPUT_STATS(Js::EmitterPhase, _u("  Total thread committed code size = %d\n"), this->GetThreadContext()->GetCodeSize());

        OUTPUT_STATS(Js::ParsePhase, _u("Script Context: 0x%p Url: %s\n"), this, this->url);
        OUTPUT_STATS(Js::ParsePhase, _u("  Total ThreadContext source size %d\n"), this->GetThreadContext()->GetSourceSize());
#endif

#ifdef ENABLE_BASIC_TELEMETRY
        if (this->telemetry != nullptr)
        {
            // If an exception (e.g. out-of-memory) happens during InitializeAllocations then `this->telemetry` will be null and the Close method will still be called, hence this guard expression.
            this->telemetry->OutputPrint();
        }
#endif

        Output::Flush();
    }